

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

__m256i * calc_sum_sse_order(__m256i *sse_hx16,__m256i *sum_hx16,uint *tot_sse,int *tot_sum)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i *in_RCX;
  int *in_RDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  int second_value;
  uint32_t first_value;
  __m256i sum_sse_order_add_final;
  __m256i sum_sse_order_add_1;
  __m256i sum_sse_order_add;
  __m256i sum_sse_add;
  __m256i sum_results;
  __m256i sum_result_3;
  __m256i sum_result_1;
  __m256i sum_result_r0;
  __m256i sse_results;
  int local_340;
  int iStack_330;
  
  auVar2 = vphaddd_avx2(*in_RDI,in_RDI[1]);
  auVar1 = vphaddw_avx2(*in_RSI,in_RSI[1]);
  auVar1 = vphaddw_avx2(auVar1,auVar1);
  auVar1 = vpermq_avx2(auVar1,8);
  auVar1 = vpmovsxwd_avx2(auVar1._0_16_);
  auVar1 = vphaddd_avx2(auVar2,auVar1);
  auVar1 = vpermq_avx2(auVar1,0xd8);
  auVar1 = vphaddd_avx2(auVar1,auVar1);
  auVar1 = vphaddd_avx2(auVar1,auVar1);
  local_340 = auVar1._0_4_;
  *in_RDX = *in_RDX + local_340;
  iStack_330 = auVar1._16_4_;
  *(int *)*in_RCX = iStack_330 + (int)(*in_RCX)[0];
  return in_RCX;
}

Assistant:

static inline __m256i calc_sum_sse_order(__m256i *sse_hx16, __m256i *sum_hx16,
                                         unsigned int *tot_sse, int *tot_sum) {
  // s00 s01 s10 s11 s20 s21 s30 s31
  const __m256i sse_results = _mm256_hadd_epi32(sse_hx16[0], sse_hx16[1]);
  // d00 d01 d02 d03 | d10 d11 d12 d13 | d20 d21 d22 d23 | d30 d31 d32 d33
  const __m256i sum_result_r0 = _mm256_hadd_epi16(sum_hx16[0], sum_hx16[1]);
  // d00 d01 d10 d11 | d00 d02 d10 d11 | d20 d21 d30 d31 | d20 d21 d30 d31
  const __m256i sum_result_1 = _mm256_hadd_epi16(sum_result_r0, sum_result_r0);
  // d00 d01 d10 d11 d20 d21 d30 d31 | X
  const __m256i sum_result_3 = _mm256_permute4x64_epi64(sum_result_1, 0x08);
  // d00 d01 d10 d11 d20 d21 d30 d31
  const __m256i sum_results =
      _mm256_cvtepi16_epi32(_mm256_castsi256_si128(sum_result_3));

  // Add sum & sse registers appropriately to get total sum & sse separately.
  // s0 s1 d0 d1 s2 s3 d2 d3
  const __m256i sum_sse_add = _mm256_hadd_epi32(sse_results, sum_results);
  // s0 s1 s2 s3 d0 d1 d2 d3
  const __m256i sum_sse_order_add = _mm256_permute4x64_epi64(sum_sse_add, 0xd8);
  // s0+s1 s2+s3 s0+s1 s2+s3 d0+d1 d2+d3 d0+d1 d2+d3
  const __m256i sum_sse_order_add_1 =
      _mm256_hadd_epi32(sum_sse_order_add, sum_sse_order_add);
  // s0 x x x | d0 x x x
  const __m256i sum_sse_order_add_final =
      _mm256_hadd_epi32(sum_sse_order_add_1, sum_sse_order_add_1);
  // s0
  const uint32_t first_value =
      (uint32_t)_mm256_extract_epi32(sum_sse_order_add_final, 0);
  *tot_sse += first_value;
  // d0
  const int second_value = _mm256_extract_epi32(sum_sse_order_add_final, 4);
  *tot_sum += second_value;
  return sum_sse_order_add;
}